

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TMS320C64xInstPrinter.c
# Opt level: O2

void TMS320C64x_post_printer(csh ud,cs_insn *insn,char *insn_asm,MCInst *mci)

{
  uint8_t uVar1;
  cs_detail *pcVar2;
  undefined8 uVar3;
  uint uVar4;
  char *pcVar5;
  ulong uVar6;
  char *__s;
  char tmp [8];
  SStream ss;
  
  if (mci->csh->detail == CS_OPT_OFF) {
    return;
  }
  pcVar2 = mci->flat_insn->detail;
  uVar4 = 0;
  uVar6 = 0;
  do {
    if (insn->detail->groups_count == uVar6) {
LAB_0023c14a:
      *(uint *)&(pcVar2->field_6).x86.operands[4].field_0x4 = uVar4;
      SStream_Init(&ss);
      uVar4 = (pcVar2->field_6).tms320c64x.condition.reg;
      if (uVar4 == 0) {
        SStream_concat0(&ss,"||||||");
      }
      else {
        uVar3 = 0x7c;
        if ((pcVar2->field_6).x86.operands[4].type == X86_OP_REG) {
          uVar3 = 0x21;
        }
        pcVar5 = cs_reg_name(ud,uVar4);
        SStream_concat(&ss,"[%c%s]|",uVar3,pcVar5);
      }
      pcVar5 = strchr(insn_asm,9);
      if (pcVar5 == (char *)0x0) {
        __s = (char *)0x0;
      }
      else {
        __s = pcVar5 + 1;
        *pcVar5 = '\0';
      }
      SStream_concat0(&ss,insn_asm);
      if ((__s == (char *)0x0) ||
         ((pcVar5 = strchr(__s,0x5b), pcVar5 == (char *)0x0 &&
          (pcVar5 = strchr(__s,0x28), pcVar5 == (char *)0x0)))) {
        tmp._0_2_ = (ushort)(byte)tmp[1] << 8;
      }
      else {
        for (; (__s < pcVar5 && (1 < (byte)(*pcVar5 + 0x9fU))); pcVar5 = pcVar5 + -1) {
        }
        if (pcVar5 == __s) {
          builtin_strncpy(insn_asm,"Invalid!",9);
          return;
        }
        if (*pcVar5 == 'a') {
          tmp[2] = '\0';
          tmp[0] = '1';
          tmp[1] = 'T';
        }
        else {
          tmp[2] = '\0';
          tmp[0] = '2';
          tmp[1] = 'T';
        }
      }
      uVar4 = *(int *)&(pcVar2->field_6).x86.operands[4].field_0x4 - 1;
      if (uVar4 < 4) {
        SStream_concat(&ss,&DAT_0051ab14 + *(int *)(&DAT_0051ab14 + (ulong)uVar4 * 4),tmp,
                       (ulong)(pcVar2->field_6).x86.operands[4].field_1.reg);
      }
      if ((pcVar2->field_6).x86.operands[4].field_1.mem.base != X86_REG_INVALID) {
        SStream_concat0(&ss,"X");
      }
      if (__s != (char *)0x0) {
        SStream_concat(&ss,"\t%s",__s);
      }
      if ((pcVar2->field_6).x86.operands[4].field_1.mem.index != X86_REG_INVALID) {
        SStream_concat(&ss,"\t||");
      }
      strcpy(insn_asm,ss.buffer);
      return;
    }
    uVar1 = insn->detail->groups[uVar6];
    if ((char)uVar1 < -0x7b) {
      uVar4 = (uint)(byte)(uVar1 + 0x81);
      goto LAB_0023c14a;
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void TMS320C64x_post_printer(csh ud, cs_insn *insn, char *insn_asm, MCInst *mci)
{
	SStream ss;
	char *p, *p2, tmp[8];
	unsigned int unit = 0;
	int i;
	cs_tms320c64x *tms320c64x;

	if (mci->csh->detail) {
		tms320c64x = &mci->flat_insn->detail->tms320c64x;

		for (i = 0; i < insn->detail->groups_count; i++) {
			switch(insn->detail->groups[i]) {
				case TMS320C64X_GRP_FUNIT_D:
					unit = TMS320C64X_FUNIT_D;
					break;
				case TMS320C64X_GRP_FUNIT_L:
					unit = TMS320C64X_FUNIT_L;
					break;
				case TMS320C64X_GRP_FUNIT_M:
					unit = TMS320C64X_FUNIT_M;
					break;
				case TMS320C64X_GRP_FUNIT_S:
					unit = TMS320C64X_FUNIT_S;
					break;
				case TMS320C64X_GRP_FUNIT_NO:
					unit = TMS320C64X_FUNIT_NO;
					break;
			}
			if (unit != 0)
				break;
		}
		tms320c64x->funit.unit = unit;

		SStream_Init(&ss);
		if (tms320c64x->condition.reg != TMS320C64X_REG_INVALID)
			SStream_concat(&ss, "[%c%s]|", (tms320c64x->condition.zero == 1) ? '!' : '|', cs_reg_name(ud, tms320c64x->condition.reg));
		else
			SStream_concat0(&ss, "||||||");

		p = strchr(insn_asm, '\t');
		if (p != NULL)
			*p++ = '\0';

		SStream_concat0(&ss, insn_asm);
		if ((p != NULL) && (((p2 = strchr(p, '[')) != NULL) || ((p2 = strchr(p, '(')) != NULL))) {
			while ((p2 > p) && ((*p2 != 'a') && (*p2 != 'b')))
				p2--;
			if (p2 == p) {
				strcpy(insn_asm, "Invalid!");
				return;
			}
			if (*p2 == 'a')
				strcpy(tmp, "1T");
			else
				strcpy(tmp, "2T");
		} else {
			tmp[0] = '\0';
		}
		switch(tms320c64x->funit.unit) {
			case TMS320C64X_FUNIT_D:
				SStream_concat(&ss, ".D%s%u", tmp, tms320c64x->funit.side);
				break;
			case TMS320C64X_FUNIT_L:
				SStream_concat(&ss, ".L%s%u", tmp, tms320c64x->funit.side);
				break;
			case TMS320C64X_FUNIT_M:
				SStream_concat(&ss, ".M%s%u", tmp, tms320c64x->funit.side);
				break;
			case TMS320C64X_FUNIT_S:
				SStream_concat(&ss, ".S%s%u", tmp, tms320c64x->funit.side);
				break;
		}
		if (tms320c64x->funit.crosspath > 0)
			SStream_concat0(&ss, "X");

		if (p != NULL)
			SStream_concat(&ss, "\t%s", p);

		if (tms320c64x->parallel != 0)
			SStream_concat(&ss, "\t||");

		/* insn_asm is a buffer from an SStream, so there should be enough space */
		strcpy(insn_asm, ss.buffer);
	}
}